

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O2

void ftmgr_fill(ftmgr *ftmgr)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ssize_t sVar4;
  __ftb *p_Var5;
  
  if (ftmgr->fd != -1) {
    while (bVar1 = ftmgr->bitmap, bVar1 != 0) {
      uVar3 = 0;
      if (bVar1 != 0) {
        for (; (bVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      sVar4 = read(ftmgr->fd,ftmgr->ftq[uVar3].blk + 4,0x1f7);
      if ((int)sVar4 < 1) {
        close(ftmgr->fd);
        ftmgr->fd = -1;
        return;
      }
      bVar1 = (byte)uVar3 & 7;
      ftmgr->bitmap = ftmgr->bitmap & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
      p_Var5 = ftmgr->ftq + uVar3;
      *(uint32_t *)p_Var5->blk = ftmgr->offset;
      ftmgr->offset = ftmgr->offset + (int)sVar4;
      p_Var5->size = (short)sVar4 + 4;
      cVar2 = ftmgr->tts;
      ftmgr->tts = cVar2 + '\x01';
      p_Var5->tts = cVar2;
    }
  }
  return;
}

Assistant:

void ftmgr_fill(struct ftmgr *ftmgr)
{
    if(ftmgr->fd == -1)
        return;
    while(ftmgr->bitmap) {
        int rn;
        uint8_t seq;
        seq = ffs(ftmgr->bitmap) - 1;

        rn =read(ftmgr->fd, ftmgr->ftq[seq].blk + BLK_HDR_SIZE, BLK_MTU - BLK_HDR_SIZE);
        if(rn <= 0) {
            close(ftmgr->fd);
            ftmgr->fd = -1;
            break;
        }

        ftmgr->bitmap &= ~(1 << seq);
        U32_TO_STREAM(ftmgr->ftq[seq].blk, ftmgr->offset);
        ftmgr->offset += rn;
        ftmgr->ftq[seq].size = rn + BLK_HDR_SIZE;
        ftmgr->ftq[seq].tts = ftmgr->tts++;
    }
}